

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lisp2c.c
# Opt level: O1

LispPTR CIntToLispInt(int cint)

{
  uint uVar1;
  int *piVar2;
  LispPTR LVar3;
  
  uVar1 = -cint;
  if (0 < cint) {
    uVar1 = cint;
  }
  if (uVar1 < 0x10000) {
    if (cint < 0) {
      LVar3 = cint & 0xffffU | 0xf0000;
    }
    else {
      LVar3 = cint | 0xe0000;
    }
  }
  else {
    piVar2 = (int *)createcell68k(2);
    *piVar2 = cint;
    if (((ulong)piVar2 & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",piVar2);
    }
    LVar3 = (LispPTR)((ulong)((long)piVar2 - (long)Lisp_world) >> 1);
  }
  return LVar3;
}

Assistant:

LispPTR CIntToLispInt(int cint) {
  if (abs(cint) > 0xFFFF) { /* its a fixp! */
    LispPTR *wordp;
    wordp = (LispPTR *)createcell68k(TYPE_FIXP);
    *((int *)wordp) = cint;
    return (LAddrFromNative(wordp));
  } else if (cint >= 0) { /* its a positive smallp! */
    return (S_POSITIVE | cint);
  } else { /* its a negative smallp! */
    return (S_NEGATIVE | (0xFFFF & cint));
  }
}